

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * fmt::v5::internal::
          parse_arg_id<wchar_t,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                    *handler)

{
  long lVar1;
  wchar_t *pwVar2;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
  *this;
  error_handler *peVar3;
  uint arg_id;
  type tVar4;
  long lVar5;
  wchar_t wVar6;
  error_handler *peVar7;
  basic_format_specs<wchar_t> *pbVar8;
  basic_string_view<wchar_t> name;
  undefined1 local_71;
  undefined1 *local_70;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_1
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (begin == end) {
    __assert_fail("begin != end",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x6fc,
                  "const Char *fmt::internal::parse_arg_id(const Char *, const Char *, IDHandler &&) [Char = wchar_t, IDHandler = fmt::internal::width_adapter<fmt::internal::specs_checker<fmt::internal::specs_handler<fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<wchar_t>>, wchar_t>>> &, wchar_t>]"
                 );
  }
  wVar6 = *begin;
  if ((wVar6 == L'}') || (wVar6 == L':')) {
    pbVar8 = (handler->handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
             ).super_specs_setter<wchar_t>.specs_;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
    ::next_arg((format_arg *)&local_68.string,
               (handler->handler->
               super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               ).context_);
    peVar7 = (error_handler *)begin;
  }
  else {
    if (9 < (uint)(wVar6 + L'\xffffffd0')) {
      if ((wVar6 != L'_') && (0x19 < (uint)((wVar6 & 0xffffffdfU) - 0x41U))) goto LAB_0020d2f0;
      lVar1 = 4;
      do {
        lVar5 = lVar1;
        pwVar2 = (wchar_t *)((long)begin + lVar5);
        if (pwVar2 == end) break;
        wVar6 = *pwVar2;
        lVar1 = lVar5 + 4;
      } while ((((uint)(wVar6 + L'\xffffffd0') < 10) || (wVar6 == L'_')) ||
              ((uint)((wVar6 & 0xffffffdfU) - 0x41U) < 0x1a));
      name.size_ = lVar5 >> 2;
      if ((long)name.size_ < 0) {
        __assert_fail("(value >= 0) && \"negative value\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/core.h"
                      ,0xd1,
                      "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                     );
      }
      pbVar8 = (handler->handler->
               super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               ).super_specs_setter<wchar_t>.specs_;
      name.data_ = begin;
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
      ::get_arg((format_arg *)&local_68.string,
                (handler->handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                ).context_,name);
      local_38 = local_58;
      uStack_30 = uStack_50;
      local_48.long_long_value = local_68.long_long_value;
      local_48.string.size = local_68.string.size;
      local_70 = &local_71;
      begin = (wchar_t *)&local_70;
      tVar4 = visit_format_arg<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
                        ((width_checker<fmt::v5::internal::error_handler> *)begin,
                         (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                          *)&local_48.string);
      if ((tVar4 & 0xffffffff80000000) == 0) {
        (pbVar8->super_align_spec).width_ = (uint)tVar4;
        return pwVar2;
      }
      goto LAB_0020d2c5;
    }
    peVar7 = (error_handler *)(begin + 1);
    arg_id = 0;
    peVar3 = peVar7;
    if (wVar6 != L'0') {
      do {
        peVar7 = peVar3;
        begin = (wchar_t *)peVar7;
        if (0xccccccc < arg_id) goto LAB_0020d2c5;
        arg_id = (wVar6 + arg_id * 10) - 0x30;
        if (peVar7 == (error_handler *)end) break;
        wVar6 = *(wchar_t *)peVar7;
        begin = (wchar_t *)(peVar7 + 4);
        peVar3 = (error_handler *)begin;
      } while ((uint)(wVar6 + L'\xffffffd0') < 10);
      if ((int)arg_id < 0) goto LAB_0020d2c5;
    }
    if ((peVar7 == (error_handler *)end) ||
       ((*(wchar_t *)peVar7 != L':' && (*(wchar_t *)peVar7 != L'}')))) {
LAB_0020d2f0:
      error_handler::on_error((error_handler *)begin,"invalid format string");
    }
    this = (handler->handler->
           super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
           ).context_;
    if (0 < (this->
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
            ).parse_context_.next_arg_id_) {
      error_handler::on_error
                ((error_handler *)begin,"cannot switch from automatic to manual argument indexing");
    }
    pbVar8 = (handler->handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
             ).super_specs_setter<wchar_t>.specs_;
    (this->
    super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
    ).parse_context_.next_arg_id_ = -1;
    context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
    ::do_get_arg((format_arg *)&local_68.string,
                 &this->
                  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
                 ,arg_id);
  }
  local_38 = local_58;
  uStack_30 = uStack_50;
  local_48.long_long_value = local_68.long_long_value;
  local_48.string.size = local_68.string.size;
  local_70 = &local_71;
  begin = (wchar_t *)&local_70;
  tVar4 = visit_format_arg<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
                    ((width_checker<fmt::v5::internal::error_handler> *)begin,
                     (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                      *)&local_48.string);
  if ((tVar4 & 0xffffffff80000000) == 0) {
    (pbVar8->super_align_spec).width_ = (uint)tVar4;
    return (wchar_t *)peVar7;
  }
LAB_0020d2c5:
  error_handler::on_error((error_handler *)begin,"number is too big");
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}